

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

bool __thiscall
MotionBase::GetValuesAtTime(MotionBase *this,double t,double *p,double *v,double *a,bool extend)

{
  byte bVar1;
  double dVar2;
  
  bVar1 = -(t <= this->tf + 1e-09) | -(this->tf < 0.0) | extend;
  if ((bVar1 & 1) != 0) {
    dVar2 = t - this->t0;
    *p = this->accel * 0.5 * dVar2 * dVar2 + this->v0 * dVar2 + this->p0;
    *v = dVar2 * this->accel + this->v0;
    *a = this->accel;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool MotionBase::GetValuesAtTime(double t, double &p, double &v, double &a, bool extend) const
{
    if ((tf < 0) || (t <= (tf+TINY)) || extend) {
        double tr = t-t0;   // time relative to start of motion
        p = p0 + v0*tr + 0.5*accel*tr*tr;
        v = v0 + accel*tr;
        a = accel;
        return true;
    }
    return false;
}